

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O1

bool __thiscall
irr::video::COpenGLDriver::setRenderTargetEx
          (COpenGLDriver *this,IRenderTarget *target,u16 clearFlag,SColor clearColor,f32 clearDepth,
          u8 clearStencil)

{
  char cVar1;
  GLuint GVar2;
  COpenGLCacheHandler *pCVar3;
  COpenGLDriver *pCVar4;
  IRenderTarget *pIVar5;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *texture;
  bool bVar6;
  ushort uVar7;
  code *pcVar8;
  ulong uVar9;
  ITexture *texture_00;
  pointer ppIVar10;
  COpenGLRenderTarget *renderTarget;
  ulong uVar11;
  undefined4 in_XMM0_Db;
  
  if ((target == (IRenderTarget *)0x0) || (target->DriverType == EDT_OPENGL)) {
    cVar1 = this->field_0x6c1;
    if (target == (IRenderTarget *)0x0) {
      if (cVar1 == '\0') {
        pIVar5 = (this->super_CNullDriver).CurrentRenderTarget;
        ppIVar10 = (pIVar5->Textures).m_data.
                   super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (ulong)((long)(pIVar5->Textures).m_data.
                               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar10) >> 3;
        if ((int)uVar11 != 0) {
          uVar9 = 0;
          do {
            texture_00 = ppIVar10[uVar9];
            if (texture_00 != (ITexture *)0x0) goto LAB_001e80e4;
            uVar9 = uVar9 + 1;
          } while ((uVar11 & 0xffffffff) != uVar9);
        }
        texture_00 = (ITexture *)0x0;
LAB_001e80e4:
        if (texture_00 != (ITexture *)0x0) {
          texture = (this->CacheHandler->
                    super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    ).TextureCache.Texture[0];
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::STextureCache::set
                    (&(this->CacheHandler->
                      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                      ).TextureCache,0,texture_00,EST_ACTIVE_ALWAYS);
          glCopyTexSubImage2D(0xde1,0,0,0,0,0,(texture_00->Size).Width,(texture_00->Size).Height);
          COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ::STextureCache::set
                    (&(this->CacheHandler->
                      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                      ).TextureCache,0,&texture->super_ITexture,EST_ACTIVE_ALWAYS);
        }
      }
      else {
        pCVar3 = this->CacheHandler;
        if ((pCVar3->
            super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
            ).FrameBufferID != 0) {
          pCVar4 = (pCVar3->
                   super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                   ).Driver;
          pcVar8 = *(code **)&pCVar4->field_0x8f8;
          if ((pcVar8 != (code *)0x0) ||
             (pcVar8 = *(code **)&pCVar4->field_0x950, pcVar8 != (code *)0x0)) {
            (*pcVar8)(0x8d40,0);
          }
          (pCVar3->
          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ).FrameBufferID = 0;
        }
      }
      (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x83])
                (this,(ulong)(this->super_CNullDriver).ScreenSize.Width,
                 (ulong)(this->super_CNullDriver).ScreenSize.Height);
      ppIVar10 = (pointer)0x0;
      uVar11 = 0;
    }
    else {
      if (cVar1 != '\0') {
        pCVar3 = this->CacheHandler;
        GVar2 = *(GLuint *)
                 ((long)&target[1].Textures.m_data.
                         super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4);
        if ((pCVar3->
            super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
            ).FrameBufferID != GVar2) {
          pCVar4 = (pCVar3->
                   super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                   ).Driver;
          pcVar8 = *(code **)&pCVar4->field_0x8f8;
          if ((pcVar8 != (code *)0x0) ||
             (pcVar8 = *(code **)&pCVar4->field_0x950, pcVar8 != (code *)0x0)) {
            (*pcVar8)(0x8d40,GVar2);
          }
          (pCVar3->
          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ).FrameBufferID = GVar2;
        }
        COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::update((COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                  *)target);
      }
      ppIVar10 = target[1].Textures.m_data.
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      uVar11 = (ulong)ppIVar10 >> 0x20;
      (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x83])
                (this,(ulong)ppIVar10 & 0xffffffff,uVar11);
    }
    if (((this->super_CNullDriver).CurrentRenderTargetSize.Width != (uint)ppIVar10) ||
       ((this->super_CNullDriver).CurrentRenderTargetSize.Height != (uint)uVar11)) {
      (this->super_CNullDriver).CurrentRenderTargetSize =
           (dimension2d<unsigned_int>)((ulong)ppIVar10 & 0xffffffff | uVar11 << 0x20);
      this->Transformation3DChanged = true;
    }
    (this->super_CNullDriver).CurrentRenderTarget = target;
    uVar7 = clearFlag | 3;
    if (cVar1 != '\0') {
      uVar7 = clearFlag;
    }
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x57])
              ((ulong)(uint)clearDepth,this,(ulong)uVar7,(ulong)clearColor.color,(ulong)clearStencil
              );
    bVar6 = true;
  }
  else {
    os::Printer::log((Printer *)
                     "Fatal Error: Tried to set a render target not owned by this driver.",
                     (double)CONCAT44(in_XMM0_Db,clearDepth));
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool COpenGLDriver::setRenderTargetEx(IRenderTarget *target, u16 clearFlag, SColor clearColor, f32 clearDepth, u8 clearStencil)
{
	if (target && target->getDriverType() != EDT_OPENGL) {
		os::Printer::log("Fatal Error: Tried to set a render target not owned by this driver.", ELL_ERROR);
		return false;
	}

	bool supportForFBO = (Feature.ColorAttachment > 0);

	core::dimension2d<u32> destRenderTargetSize(0, 0);

	if (target) {
		COpenGLRenderTarget *renderTarget = static_cast<COpenGLRenderTarget *>(target);

		if (supportForFBO) {
			CacheHandler->setFBO(renderTarget->getBufferID());
			renderTarget->update();
		}

		destRenderTargetSize = renderTarget->getSize();

		setViewPortRaw(destRenderTargetSize.Width, destRenderTargetSize.Height);
	} else {
		if (supportForFBO)
			CacheHandler->setFBO(0);
		else {
			COpenGLRenderTarget *prevRenderTarget = static_cast<COpenGLRenderTarget *>(CurrentRenderTarget);
			COpenGLTexture *renderTargetTexture = static_cast<COpenGLTexture *>(prevRenderTarget->getTexture());

			if (renderTargetTexture) {
				const COpenGLTexture *prevTexture = CacheHandler->getTextureCache()[0];

				CacheHandler->getTextureCache().set(0, renderTargetTexture);

				const core::dimension2d<u32> size = renderTargetTexture->getSize();
				glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 0, 0, size.Width, size.Height);

				CacheHandler->getTextureCache().set(0, prevTexture);
			}
		}

		destRenderTargetSize = core::dimension2d<u32>(0, 0);

		setViewPortRaw(ScreenSize.Width, ScreenSize.Height);
	}

	if (CurrentRenderTargetSize != destRenderTargetSize) {
		CurrentRenderTargetSize = destRenderTargetSize;

		Transformation3DChanged = true;
	}

	CurrentRenderTarget = target;

	if (!supportForFBO) {
		clearFlag |= ECBF_COLOR;
		clearFlag |= ECBF_DEPTH;
	}

	clearBuffers(clearFlag, clearColor, clearDepth, clearStencil);

	return true;
}